

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msg.cpp
# Opt level: O0

int __thiscall zmq::msg_t::init(msg_t *this,EVP_PKEY_CTX *ctx)

{
  msg_t *this_local;
  
  (this->_u).base.metadata = (metadata_t *)0x0;
  (this->_u).base.type = 'e';
  (this->_u).base.flags = '\0';
  (this->_u).base.unused[0x21] = '\0';
  *(undefined1 *)((long)&this->_u + 0x31) = 0;
  *(undefined1 *)((long)&this->_u + 0x30) = 0;
  (this->_u).base.routing_id = 0;
  return 0;
}

Assistant:

int zmq::msg_t::init ()
{
    _u.vsm.metadata = NULL;
    _u.vsm.type = type_vsm;
    _u.vsm.flags = 0;
    _u.vsm.size = 0;
    _u.vsm.group.sgroup.group[0] = '\0';
    _u.vsm.group.type = group_type_short;
    _u.vsm.routing_id = 0;
    return 0;
}